

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

void __thiscall
QCss::StyleSelector::matchRule
          (StyleSelector *this,NodePtr node,StyleRule *rule,StyleSheetOrigin origin,int depth,
          QMultiMap<unsigned_int,_QCss::StyleRule> *weightedRules)

{
  long lVar1;
  bool bVar2;
  QList<QCss::Selector> *this_00;
  qsizetype qVar3;
  StyleRule *this_01;
  QList<QCss::Selector> *in_RDX;
  StyleRule *in_RDI;
  long in_FS_OFFSET;
  Selector *selector;
  int j;
  uint weight;
  StyleRule newRule;
  StyleRule *in_stack_ffffffffffffff48;
  StyleRule *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar4;
  iterator in_stack_ffffffffffffff70;
  int local_7c;
  undefined1 local_40 [32];
  NodePtr in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_7c = 0;
  while( true ) {
    this_00 = (QList<QCss::Selector> *)(long)local_7c;
    qVar3 = QList<QCss::Selector>::size(in_RDX);
    if (qVar3 <= (long)this_00) break;
    this_01 = (StyleRule *)
              QList<QCss::Selector>::at
                        (&in_stack_ffffffffffffff50->selectors,(qsizetype)in_stack_ffffffffffffff48)
    ;
    bVar2 = selectorMatches((StyleSelector *)in_stack_ffffffffffffff70._M_node,(Selector *)in_RDI,
                            in_stack_ffffffffffffffe0);
    if (bVar2) {
      uVar4 = *(undefined4 *)&in_RDX[2].d.d;
      Selector::specificity((Selector *)in_stack_ffffffffffffff70._M_node);
      memset(local_40,0xaa,0x38);
      StyleRule::StyleRule(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      qVar3 = QList<QCss::Selector>::size(in_RDX);
      if (1 < qVar3) {
        in_stack_ffffffffffffff50 = this_01;
        QList<QCss::Selector>::resize(this_00,CONCAT44(uVar4,in_stack_ffffffffffffff58));
        this_01 = in_stack_ffffffffffffff50;
        QList<QCss::Selector>::operator[]
                  (&in_stack_ffffffffffffff50->selectors,(qsizetype)in_stack_ffffffffffffff48);
        Selector::operator=((Selector *)in_stack_ffffffffffffff50,
                            (Selector *)in_stack_ffffffffffffff48);
      }
      in_stack_ffffffffffffff70._M_node =
           (_Base_ptr)
           QMultiMap<unsigned_int,_QCss::StyleRule>::insert
                     ((QMultiMap<unsigned_int,_QCss::StyleRule> *)this_01,
                      &(in_stack_ffffffffffffff70._M_node)->_M_color,in_RDI);
      StyleRule::~StyleRule(in_stack_ffffffffffffff50);
    }
    local_7c = local_7c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void StyleSelector::matchRule(NodePtr node, const StyleRule &rule, StyleSheetOrigin origin,
                               int depth, QMultiMap<uint, StyleRule> *weightedRules)
{
    for (int j = 0; j < rule.selectors.size(); ++j) {
        const Selector& selector = rule.selectors.at(j);
        if (selectorMatches(selector, node)) {
            uint weight = rule.order
                        + selector.specificity() *0x100
                        + (uint(origin) + depth)*0x100000;
            StyleRule newRule = rule;
            if (rule.selectors.size() > 1) {
                newRule.selectors.resize(1);
                newRule.selectors[0] = selector;
            }
            //We might have rules with the same weight if they came from a rule with several selectors
            weightedRules->insert(weight, newRule);
        }
    }
}